

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

Option * __thiscall CLI::App::add_flag(App *this,string *name,string *description)

{
  Option *this_00;
  IncorrectConstruction *__return_storage_ptr__;
  allocator local_e9;
  callback_t fun;
  string local_c0;
  string local_a0;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_80;
  string local_60;
  string local_40;
  
  fun.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  fun.super__Function_base._M_functor._8_8_ = 0;
  fun._M_invoker =
       std::
       _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/App.hpp:370:31)>
       ::_M_invoke;
  fun.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/App.hpp:370:31)>
       ::_M_manager;
  ::std::__cxx11::string::string((string *)&local_60,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_80,&fun);
  ::std::__cxx11::string::string((string *)&local_a0,(string *)description);
  this_00 = add_option(this,&local_60,&local_80,&local_a0,false);
  ::std::__cxx11::string::~string((string *)&local_a0);
  std::_Function_base::~_Function_base(&local_80.super__Function_base);
  ::std::__cxx11::string::~string((string *)&local_60);
  if ((this_00->pname_)._M_string_length == 0) {
    ::std::__cxx11::string::string((string *)&local_c0,"",&local_e9);
    Option::set_custom_option(this_00,&local_c0,0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    std::_Function_base::~_Function_base(&fun.super__Function_base);
    return this_00;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_40,(string *)name);
  IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_40);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

Option *add_flag(std::string name, std::string description = "") {
        CLI::callback_t fun = [](CLI::results_t) { return true; };

        Option *opt = add_option(name, fun, description, false);
        if(opt->get_positional())
            throw IncorrectConstruction::PositionalFlag(name);
        opt->set_custom_option("", 0);
        return opt;
    }